

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O0

void __thiscall
ktx::CommandExtract::saveEXR
          (CommandExtract *this,string *filepath,bool appendExtension,VkFormat vkFormat,
          FormatDescriptor *format,uint32_t width,uint32_t height,int pixelType,char *data,
          size_t size)

{
  vector<int,_std::allocator<int>_> *this_00;
  int in_ECX;
  byte in_DL;
  string *in_RSI;
  FormatDescriptor *in_R8;
  vector<int,_std::allocator<int>_> *in_stack_00000020;
  uint32_t in_stack_00000474;
  FormatDescriptor *in_stack_00000478;
  VkFormat in_stack_00000480;
  undefined1 in_stack_00000487;
  string *in_stack_00000488;
  CommandExtract *in_stack_00000490;
  uint32_t in_stack_000004a0;
  vector<int,_std::allocator<int>_> *in_stack_000004a8;
  char *in_stack_000004b0;
  size_t in_stack_000004b8;
  allocator_type *in_stack_ffffffffffffff38;
  value_type_conflict5 *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  uint local_9c;
  string local_48 [40];
  FormatDescriptor *local_20;
  int local_18;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_20 = in_R8;
  local_18 = in_ECX;
  std::__cxx11::string::string(local_48,in_RSI);
  if (local_18 == 0x7b) {
    local_9c = 3;
  }
  else {
    local_9c = FormatDescriptor::channelCount(local_20);
  }
  this_00 = (vector<int,_std::allocator<int>_> *)(ulong)local_9c;
  std::allocator<int>::allocator((allocator<int> *)0x270d3a);
  std::vector<int,_std::allocator<int>_>::vector
            (this_00,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  saveEXR(in_stack_00000490,in_stack_00000488,(bool)in_stack_00000487,in_stack_00000480,
          in_stack_00000478,in_stack_00000474,in_stack_000004a0,in_stack_000004a8,in_stack_000004b0,
          in_stack_000004b8);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_00000020);
  std::allocator<int>::~allocator((allocator<int> *)0x270dc2);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void CommandExtract::saveEXR(std::string filepath, bool appendExtension,
        VkFormat vkFormat, const FormatDescriptor& format, uint32_t width, uint32_t height,
        int pixelType, const char* data, std::size_t size) {
    saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height,
            std::vector<int>(vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32 ? 3 : format.channelCount(), pixelType),
            data, size);
}